

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O2

void __thiscall
NewScopeLayer::NewScopeLayer
          (NewScopeLayer *this,NewScopeLayer *parent,string *name,Symbol *class_symbol,
          Symbol *method_symbol)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->parent_ = parent;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->class_symbol_,(string *)class_symbol);
  std::__cxx11::string::string((string *)&this->method_symbol_,(string *)method_symbol);
  this->traverse_index = 0;
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->arrays_)._M_h._M_buckets = &(this->arrays_)._M_h._M_single_bucket;
  (this->arrays_)._M_h._M_bucket_count = 1;
  (this->arrays_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->arrays_)._M_h._M_element_count = 0;
  (this->arrays_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arrays_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->arrays_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->user_type_system_)._M_h._M_buckets = &(this->user_type_system_)._M_h._M_single_bucket;
  (this->user_type_system_)._M_h._M_bucket_count = 1;
  (this->user_type_system_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->user_type_system_)._M_h._M_element_count = 0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->user_type_system_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbol_types_)._M_h._M_buckets = &(this->symbol_types_)._M_h._M_single_bucket;
  (this->symbol_types_)._M_h._M_bucket_count = 1;
  (this->symbol_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbol_types_)._M_h._M_element_count = 0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbol_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AddChild(this->parent_,this);
  return;
}

Assistant:

NewScopeLayer::NewScopeLayer(NewScopeLayer* parent, std::string name,
                             const Symbol& class_symbol,
                             const Symbol& method_symbol)
    : parent_(parent),
      name_(std::move(name)),
      class_symbol_(class_symbol),
      method_symbol_(method_symbol),
      traverse_index(0) {
  parent_->AddChild(this);
}